

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

unqlite_kv_methods * unqliteFindKVStore(char *zName,sxu32 nByte)

{
  unqlite_kv_methods *puVar1;
  void *pvVar2;
  sxu32 sVar3;
  sxu32 sVar4;
  sxi32 sVar5;
  uint local_34;
  sxu32 nMax;
  sxu32 n;
  unqlite_kv_methods *pEntry;
  unqlite_kv_methods **apStore;
  sxu32 nByte_local;
  char *zName_local;
  
  sVar3 = sUnqlMPGlobal.kv_storage.nUsed;
  pvVar2 = sUnqlMPGlobal.kv_storage.pBase;
  local_34 = 0;
  while( true ) {
    if (sVar3 <= local_34) {
      return (unqlite_kv_methods *)0x0;
    }
    puVar1 = *(unqlite_kv_methods **)((long)pvVar2 + (ulong)local_34 * 8);
    sVar4 = SyStrlen(puVar1->zName);
    if ((nByte == sVar4) && (sVar5 = SyStrnicmp(puVar1->zName,zName,nByte), sVar5 == 0)) break;
    local_34 = local_34 + 1;
  }
  return puVar1;
}

Assistant:

UNQLITE_PRIVATE unqlite_kv_methods * unqliteFindKVStore(
	const char *zName, /* Storage engine name [i.e. Hash, B+tree, LSM, etc.] */
	sxu32 nByte /* zName length */
	)
{
	unqlite_kv_methods **apStore,*pEntry;
	sxu32 n,nMax;
	/* Point to the set of installed engines */
	apStore = (unqlite_kv_methods **)SySetBasePtr(&sUnqlMPGlobal.kv_storage);
	nMax = SySetUsed(&sUnqlMPGlobal.kv_storage);
	for( n = 0 ; n < nMax; ++n ){
		pEntry = apStore[n];
		if( nByte == SyStrlen(pEntry->zName) && SyStrnicmp(pEntry->zName,zName,nByte) == 0 ){
			/* Storage engine found */
			return pEntry;
		}
	}
	/* No such entry, return NULL */
	return 0;
}